

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O0

SessionID * __thiscall
FIX::Message::getSessionID(SessionID *__return_storage_ptr__,Message *this,string *qualifier)

{
  FieldMap *pFVar1;
  string *beginString_00;
  string *senderCompID_00;
  string *targetCompID_00;
  undefined1 local_150 [8];
  TargetCompID targetCompID;
  undefined1 local_e0 [8];
  SenderCompID senderCompID;
  BeginString beginString;
  string *qualifier_local;
  Message *this_local;
  
  BeginString::BeginString
            ((BeginString *)&senderCompID.super_StringField.super_FieldBase.m_metrics.m_checksum);
  SenderCompID::SenderCompID((SenderCompID *)local_e0);
  TargetCompID::TargetCompID((TargetCompID *)local_150);
  pFVar1 = &getHeader(this)->super_FieldMap;
  FieldMap::getField(pFVar1,(FieldBase *)
                            &senderCompID.super_StringField.super_FieldBase.m_metrics.m_checksum);
  pFVar1 = &getHeader(this)->super_FieldMap;
  FieldMap::getField(pFVar1,(FieldBase *)local_e0);
  pFVar1 = &getHeader(this)->super_FieldMap;
  FieldMap::getField(pFVar1,(FieldBase *)local_150);
  beginString_00 =
       StringField::operator_cast_to_string_
                 ((StringField *)
                  &senderCompID.super_StringField.super_FieldBase.m_metrics.m_checksum);
  senderCompID_00 = StringField::operator_cast_to_string_((StringField *)local_e0);
  targetCompID_00 = StringField::operator_cast_to_string_((StringField *)local_150);
  SessionID::SessionID
            (__return_storage_ptr__,beginString_00,senderCompID_00,targetCompID_00,qualifier);
  TargetCompID::~TargetCompID((TargetCompID *)local_150);
  SenderCompID::~SenderCompID((SenderCompID *)local_e0);
  BeginString::~BeginString
            ((BeginString *)&senderCompID.super_StringField.super_FieldBase.m_metrics.m_checksum);
  return __return_storage_ptr__;
}

Assistant:

SessionID Message::getSessionID( const std::string& qualifier ) const
EXCEPT ( FieldNotFound )
{
  BeginString beginString;
  SenderCompID senderCompID;
  TargetCompID targetCompID;

  getHeader().getField( beginString );
  getHeader().getField( senderCompID );
  getHeader().getField( targetCompID );

  return SessionID( beginString, senderCompID, targetCompID, qualifier );
}